

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_demo.cpp
# Opt level: O0

void __thiscall despot::RegDemo::PrintState(RegDemo *this,State *s,ostream *out)

{
  const_reference pvVar1;
  int local_3c;
  char local_38 [4];
  int x;
  char buffer [20];
  ostream *out_local;
  State *s_local;
  RegDemo *this_local;
  
  unique0x100000ec = out;
  for (local_3c = 0; local_3c < this->size_; local_3c = local_3c + 1) {
    if (local_3c == this->size_ + -1) {
      if (*(int *)(s + 0xc) == local_3c) {
        std::operator<<(stack0xffffffffffffffe0,"T     ");
      }
      else {
        std::operator<<(stack0xffffffffffffffe0,"G     ");
      }
    }
    else if (*(int *)(s + 0xc) == local_3c) {
      std::operator<<(stack0xffffffffffffffe0,"R     ");
    }
    else {
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&this->trap_prob_,(long)local_3c);
      sprintf(local_38,"%4.3f ",*pvVar1);
      std::operator<<(stack0xffffffffffffffe0,local_38);
    }
  }
  std::ostream::operator<<(stack0xffffffffffffffe0,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void RegDemo::PrintState(const State& s, ostream& out) const {
	char buffer[20];
	for (int x = 0; x < size_; x++) {
		if (x == size_ - 1) {
			if (s.state_id == x)
				out << "T     ";
			else
				out << "G     ";
		} else {
			if (s.state_id == x)
				out << "R     ";
			else {
				sprintf(buffer, "%4.3f ", trap_prob_[x]);
				out << buffer;
			}
		}
	}
	out << endl;
}